

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O0

void Assimp::ExportSceneObj
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *param_4)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer pIVar4;
  undefined8 uVar5;
  streamoff sVar6;
  IOStream *__p;
  DeadlyImportError *pDVar7;
  fpos local_628 [16];
  string local_618 [39];
  undefined1 local_5f1;
  string local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  string local_588;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_568;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> outfile_1;
  string local_550 [38];
  undefined1 local_52a;
  allocator<char> local_529;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_4e8;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> outfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  undefined1 local_488 [8];
  ObjExporter exporter;
  ExportProperties *param_3_local;
  aiScene *pScene_local;
  IOSystem *pIOSystem_local;
  char *pFile_local;
  
  exporter.endl.field_2._8_8_ = param_4;
  ObjExporter::ObjExporter((ObjExporter *)local_488,pFile,pScene,false);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    bVar1 = std::ios::fail();
    if ((bVar1 & 1) == 0) {
      iVar3 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
      std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
      unique_ptr<std::default_delete<Assimp::IOStream>,void>
                ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_4e8,
                 (pointer)CONCAT44(extraout_var,iVar3));
      bVar2 = std::operator==(&local_4e8,(nullptr_t)0x0);
      if (bVar2) {
        local_52a = 1;
        pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,pFile,&local_529);
        std::operator+(&local_508,"could not open output .obj file: ",&local_528);
        DeadlyImportError::DeadlyImportError(pDVar7,&local_508);
        local_52a = 0;
        __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                         (&local_4e8);
      std::__cxx11::ostringstream::str();
      uVar5 = std::__cxx11::string::c_str();
      outfile_1._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
      ._M_t.super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
      super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
           (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
           std::ostream::tellp();
      sVar6 = std::fpos::operator_cast_to_long((fpos *)&outfile_1);
      (*pIVar4->_vptr_IOStream[3])(pIVar4,uVar5,sVar6,1);
      std::__cxx11::string::~string(local_550);
      std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                (&local_4e8);
      ObjExporter::GetMaterialLibFileName_abi_cxx11_(&local_588,(ObjExporter *)local_488);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"wt",&local_5a9);
      __p = IOSystem::Open(pIOSystem,&local_588,&local_5a8);
      std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
      unique_ptr<std::default_delete<Assimp::IOStream>,void>
                ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_568,
                 __p);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::allocator<char>::~allocator(&local_5a9);
      std::__cxx11::string::~string((string *)&local_588);
      bVar2 = std::operator==(&local_568,(nullptr_t)0x0);
      if (!bVar2) {
        pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::
                 operator->(&local_568);
        std::__cxx11::ostringstream::str();
        uVar5 = std::__cxx11::string::c_str();
        local_628 = (fpos  [16])std::ostream::tellp();
        sVar6 = std::fpos::operator_cast_to_long(local_628);
        (*pIVar4->_vptr_IOStream[3])(pIVar4,uVar5,sVar6,1);
        std::__cxx11::string::~string(local_618);
        std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                  (&local_568);
        ObjExporter::~ObjExporter((ObjExporter *)local_488);
        return;
      }
      local_5f1 = 1;
      pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      ObjExporter::GetMaterialLibFileName_abi_cxx11_(&local_5f0,(ObjExporter *)local_488);
      std::operator+(&local_5d0,"could not open output .mtl file: ",&local_5f0);
      DeadlyImportError::DeadlyImportError(pDVar7,&local_5d0);
      local_5f1 = 0;
      __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
  }
  outfile._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._6_1_ = 1;
  pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,pFile,
             (allocator<char> *)
             ((long)&outfile._M_t.
                     super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>
                     .super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl + 7));
  std::operator+(&local_4b8,"output data creation failed. Most likely the file became too large: ",
                 &local_4d8);
  DeadlyImportError::DeadlyImportError(pDVar7,&local_4b8);
  outfile._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl._6_1_ = 0;
  __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void ExportSceneObj(const char* pFile,IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/) {
    // invoke the exporter
    ObjExporter exporter(pFile, pScene);

    if (exporter.mOutput.fail() || exporter.mOutputMat.fail()) {
        throw DeadlyExportError("output data creation failed. Most likely the file became too large: " + std::string(pFile));
    }

    // we're still here - export successfully completed. Write both the main OBJ file and the material script
    {
        std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
        if(outfile == NULL) {
            throw DeadlyExportError("could not open output .obj file: " + std::string(pFile));
        }
        outfile->Write( exporter.mOutput.str().c_str(), static_cast<size_t>(exporter.mOutput.tellp()),1);
    }
    {
        std::unique_ptr<IOStream> outfile (pIOSystem->Open(exporter.GetMaterialLibFileName(),"wt"));
        if(outfile == NULL) {
            throw DeadlyExportError("could not open output .mtl file: " + std::string(exporter.GetMaterialLibFileName()));
        }
        outfile->Write( exporter.mOutputMat.str().c_str(), static_cast<size_t>(exporter.mOutputMat.tellp()),1);
    }
}